

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Bitmask sqlite3WhereExprListUsage(WhereMaskSet *pMaskSet,ExprList *pList)

{
  Bitmask BVar1;
  ExprList_item *pEVar2;
  long lVar3;
  Bitmask BVar4;
  
  if (pList == (ExprList *)0x0) {
    BVar4 = 0;
  }
  else {
    pEVar2 = pList->a;
    BVar4 = 0;
    for (lVar3 = 0; lVar3 < pList->nExpr; lVar3 = lVar3 + 1) {
      BVar1 = sqlite3WhereExprUsage(pMaskSet,pEVar2->pExpr);
      BVar4 = BVar4 | BVar1;
      pEVar2 = pEVar2 + 1;
    }
  }
  return BVar4;
}

Assistant:

SQLITE_PRIVATE Bitmask sqlite3WhereExprListUsage(WhereMaskSet *pMaskSet, ExprList *pList){
  int i;
  Bitmask mask = 0;
  if( pList ){
    for(i=0; i<pList->nExpr; i++){
      mask |= sqlite3WhereExprUsage(pMaskSet, pList->a[i].pExpr);
    }
  }
  return mask;
}